

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::fill<kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest)

{
  char *pcVar1;
  StringTree local_48;
  
  pcVar1 = (char *)(this->text).content.size_;
  if (pcVar1 != (char *)0x0) {
    pcVar1 = (this->text).content.ptr;
  }
  (this->branches).ptr[branchIndex].index = (long)pos - (long)pcVar1;
  local_48.text.content.size_ = (first->content).size_;
  local_48.size_ = 0;
  if (local_48.text.content.size_ != 0) {
    local_48.size_ = local_48.text.content.size_ - 1;
  }
  local_48.text.content.ptr = (first->content).ptr;
  local_48.text.content.disposer = (first->content).disposer;
  (first->content).ptr = (char *)0x0;
  (first->content).size_ = 0;
  local_48.branches.disposer = (ArrayDisposer *)0x0;
  local_48.branches.ptr = (Branch *)0x0;
  local_48.branches.size_ = 0;
  operator=(&(this->branches).ptr[branchIndex].content,&local_48);
  ~StringTree(&local_48);
  _::fill<kj::ArrayPtr<char_const>>(pos,rest);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}